

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_bitset_container_xor(run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *__dest;
  rle16_t *prVar3;
  uint uVar4;
  int iVar5;
  bitset_container_t *bitset;
  array_container_t *paVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  bitset = bitset_container_create();
  bitset->cardinality = src_2->cardinality;
  __dest = bitset->words;
  memcpy(__dest,src_2->words,0x2000);
  iVar5 = src_1->n_runs;
  if (0 < (long)iVar5) {
    prVar3 = src_1->runs;
    lVar7 = 0;
    do {
      uVar1 = prVar3[lVar7].value;
      uVar2 = prVar3[lVar7].length;
      if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
        uVar4 = (uint)uVar2 + (uint)uVar1;
        uVar8 = (ulong)(uint)(uVar1 >> 6);
        uVar9 = uVar4 >> 6;
        __dest[uVar8] = ~(-1L << ((byte)uVar1 & 0x3f) ^ __dest[uVar8]);
        if (uVar1 >> 6 < uVar9) {
          do {
            __dest[uVar8] = ~__dest[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
        __dest[uVar9] = __dest[uVar9] ^ 0xffffffffffffffffU >> (~(byte)uVar4 & 0x3f);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar5);
  }
  iVar5 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar5;
  if (iVar5 < 0x1001) {
    paVar6 = array_container_from_bitset(bitset);
    *dst = paVar6;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  return 0x1000 < iVar5;
}

Assistant:

bool run_bitset_container_xor(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_2, result);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_flip_range(result->words, rle.value,
                          rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}